

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scanner.cpp
# Opt level: O1

void __thiscall Refal2::CScanner::preprocessingStringAfterBackslash(CScanner *this,char c)

{
  uint uVar1;
  undefined7 in_register_00000031;
  
  this->preprocessingState = PS_String;
  uVar1 = (int)CONCAT71(in_register_00000031,c) - 0x5c;
  switch(uVar1 >> 1 | (uint)((uVar1 & 1) != 0) << 0x1f) {
  case 0:
    break;
  default:
    if ((c & 0xf8U) == 0x30) {
      this->octalCodeOne = c;
      this->preprocessingState = PS_StringOctalCodeOne;
      return;
    }
    std::__cxx11::string::push_back((char)this + -0x50);
    preprocessing(this,c);
    return;
  case 3:
    break;
  case 5:
    break;
  case 9:
    break;
  case 0xb:
    break;
  case 0xc:
    break;
  case 0xd:
  }
  std::__cxx11::string::push_back((char)this + -0x50);
  return;
}

Assistant:

void CScanner::preprocessingStringAfterBackslash( char c )
{
	preprocessingState = PS_String;
	switch( c ) {
		case 'n':
			token.word.push_back( LineFeed );
			break;
		case 't':
			token.word.push_back( HorizontalTabulation );
			break;
		case 'v':
			token.word.push_back( '\v' );
			break;
		case 'b':
			token.word.push_back( '\b' );
			break;
		case 'r':
			token.word.push_back( CarriageReturn );
			break;
		case 'f':
			token.word.push_back( '\f' );
			break;
		case Backslash:
			token.word.push_back( Backslash );
			break;
		default:
			if( IsOctal( c ) ) {
				octalCodeOne = c;
				preprocessingState = PS_StringOctalCodeOne;
			} else {
				token.word.push_back( Backslash );
				preprocessing( c );
			}
			break;
	}
}